

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O0

PermutationMatrix<_1,__1,_int> * __thiscall
Eigen::PermutationMatrix<-1,_-1,_int>::operator=
          (PermutationMatrix<_1,__1,_int> *this,PermutationMatrix<_1,__1,_int> *other)

{
  PermutationMatrix<_1,__1,_int> *other_local;
  PermutationMatrix<_1,__1,_int> *this_local;
  
  Matrix<int,_-1,_1,_0,_-1,_1>::operator=(&this->m_indices,&other->m_indices);
  return this;
}

Assistant:

PermutationMatrix& operator=(const PermutationMatrix& other)
    {
      m_indices = other.m_indices;
      return *this;
    }